

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::UdpBodySyntax::UdpBodySyntax
          (UdpBodySyntax *this,SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *portDecls,
          UdpInitialStmtSyntax *initialStmt,Token table,
          SyntaxList<slang::syntax::UdpEntrySyntax> *entries,Token endtable)

{
  size_t sVar1;
  pointer ppUVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar6 = table._0_8_;
  (this->super_SyntaxNode).kind = UdpBody;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  uVar4 = *(undefined4 *)&(portDecls->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (portDecls->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->portDecls).super_SyntaxListBase.super_SyntaxNode.kind =
       (portDecls->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->portDecls).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->portDecls).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->portDecls).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (portDecls->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->portDecls).super_SyntaxListBase.childCount = (portDecls->super_SyntaxListBase).childCount;
  (this->portDecls).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005ca6b0
  ;
  sVar1 = (portDecls->elements)._M_extent._M_extent_value;
  (this->portDecls).elements._M_ptr = (portDecls->elements)._M_ptr;
  (this->portDecls).elements._M_extent._M_extent_value = sVar1;
  this->initialStmt = initialStmt;
  (this->table).kind = (short)uVar6;
  (this->table).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->table).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->table).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->table).info = table.info;
  uVar4 = *(undefined4 *)&(entries->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (entries->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->entries).super_SyntaxListBase.super_SyntaxNode.kind =
       (entries->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->entries).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->entries).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->entries).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (entries->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->entries).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005c7548;
  (this->entries).super_SyntaxListBase.childCount = (entries->super_SyntaxListBase).childCount;
  sVar1 = (entries->super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>._M_ptr =
       (entries->super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>)._M_ptr;
  (this->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->entries).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005cbae8;
  (this->endtable).kind = endtable.kind;
  (this->endtable).field_0x2 = endtable._2_1_;
  (this->endtable).numFlags = (NumericTokenFlags)endtable.numFlags.raw;
  (this->endtable).rawLen = endtable.rawLen;
  (this->endtable).info = endtable.info;
  (this->portDecls).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  uVar7 = (this->portDecls).elements._M_extent._M_extent_value + 1;
  if (1 < uVar7) {
    uVar7 = uVar7 >> 1;
    lVar8 = 0;
    do {
      ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->portDecls).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar8));
      (*ppSVar5)->parent = &this->super_SyntaxNode;
      lVar8 = lVar8 + 0x30;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    initialStmt = this->initialStmt;
  }
  if (initialStmt != (UdpInitialStmtSyntax *)0x0) {
    (initialStmt->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  (this->entries).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  sVar1 = (this->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppUVar2 = (this->entries).super_span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL>.
              _M_ptr;
    lVar8 = 0;
    do {
      *(UdpBodySyntax **)(*(long *)((long)ppUVar2 + lVar8) + 8) = this;
      lVar8 = lVar8 + 8;
    } while (sVar1 << 3 != lVar8);
  }
  return;
}

Assistant:

UdpBodySyntax(const SeparatedSyntaxList<UdpPortDeclSyntax>& portDecls, UdpInitialStmtSyntax* initialStmt, Token table, const SyntaxList<UdpEntrySyntax>& entries, Token endtable) :
        SyntaxNode(SyntaxKind::UdpBody), portDecls(portDecls), initialStmt(initialStmt), table(table), entries(entries), endtable(endtable) {
        this->portDecls.parent = this;
        for (auto child : this->portDecls)
            child->parent = this;
        if (this->initialStmt) this->initialStmt->parent = this;
        this->entries.parent = this;
        for (auto child : this->entries)
            child->parent = this;
    }